

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxc.cxx
# Opt level: O1

XCKernel __thiscall ExchCXX::libxc_kernel_factory(ExchCXX *this,Kernel kern,Spin spin_polar)

{
  long *plVar1;
  tuple<ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
  this_00;
  exchcxx_exception *this_01;
  long *plVar2;
  long *plVar3;
  __uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
  local_70;
  string local_68;
  string local_48;
  
  plVar2 = *(long **)(libxc_kernel_map + ((ulong)(long)(int)kern % _DAT_011714c8) * 8);
  plVar3 = (long *)0x0;
  if ((plVar2 != (long *)0x0) &&
     (plVar1 = (long *)*plVar2, plVar3 = plVar2, *(Kernel *)((long *)*plVar2 + 1) != kern)) {
    while (plVar2 = plVar1, plVar1 = (long *)*plVar2, plVar1 != (long *)0x0) {
      plVar3 = (long *)0x0;
      if (((ulong)(long)(int)*(Kernel *)(plVar1 + 1) % _DAT_011714c8 !=
           (ulong)(long)(int)kern % _DAT_011714c8) ||
         (plVar3 = plVar2, *(Kernel *)(plVar1 + 1) == kern)) goto LAB_001d8cc4;
    }
    plVar3 = (long *)0x0;
  }
LAB_001d8cc4:
  if ((plVar3 != (long *)0x0) && (*plVar3 != 0)) {
    this_00.
    super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
    .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
          )operator_new(0x1b8);
    detail::LibxcKernelImpl::LibxcKernelImpl
              ((LibxcKernelImpl *)
               this_00.
               super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
               .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl,kern,
               spin_polar);
    local_70._M_t.
    super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
    .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl =
         (tuple<ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
          )(tuple<ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
            )this_00.
             super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
             .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl;
    XCKernel::XCKernel((XCKernel *)this,(impl_ptr *)&local_70);
    if ((_Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
         )local_70._M_t.
          super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
          .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl !=
        (XCKernelImpl *)0x0) {
      (**(code **)(*(long *)local_70._M_t.
                            super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                            .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>.
                            _M_head_impl + 8))();
    }
    return (impl_ptr)(impl_ptr)this;
  }
  this_01 = (exchcxx_exception *)__cxa_allocate_exception(0x50);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]ExchCXX/src/libxc.cxx"
             ,"");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"KERNEL NYI FOR Libxc BACKEND","");
  exchcxx_exception::exchcxx_exception(this_01,&local_48,0x7b,&local_68);
  __cxa_throw(this_01,&exchcxx_exception::typeinfo,exchcxx_exception::~exchcxx_exception);
}

Assistant:

XCKernel libxc_kernel_factory(const Kernel kern, 
  const Spin spin_polar ) {

  EXCHCXX_BOOL_CHECK( "KERNEL NYI FOR Libxc BACKEND", libxc_supports_kernel(kern) )

  return XCKernel( 
    std::make_unique< detail::LibxcKernelImpl >( kern, spin_polar ) );

}